

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCallTest.cpp
# Opt level: O2

void __thiscall
TEST_GROUP_CppUTestGroupMockCheckedActualCall::~TEST_GROUP_CppUTestGroupMockCheckedActualCall
          (TEST_GROUP_CppUTestGroupMockCheckedActualCall *this)

{
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x20);
  return;
}

Assistant:

TEST_GROUP(MockCheckedActualCall)
{
    MockExpectedCallsList* emptyList;
    MockExpectedCallsList* list;
    MockFailureReporter* reporter;

    void setup() _override
    {
        emptyList = new MockExpectedCallsList;
        list = new MockExpectedCallsList;
        reporter = MockFailureReporterForTest::getReporter();
    }

    void teardown() _override
    {
        CHECK_NO_MOCK_FAILURE();

        MockFailureReporterForTest::clearReporter();

        delete emptyList;
        delete list;
    }
}